

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.hpp
# Opt level: O0

void __thiscall
helics::InputData::InputData
          (InputData *this,string_view n_name,string_view n_type,string_view n_units)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  double in_stack_ffffffffffffff68;
  data_view *in_stack_ffffffffffffff70;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_3e;
  allocator<char> local_3d [20];
  allocator<char> local_29 [41];
  
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)in_RDI);
  IdentifierId<unsigned_int,_(helics::Identifiers)105,_4294967295U>::IdentifierId
            ((IdentifierId<unsigned_int,_(helics::Identifiers)105,_4294967295U> *)
             ((long)&in_RDI->_M_len + 4));
  data_view::data_view(in_stack_ffffffffffffff70);
  __a = (allocator<char> *)0x0;
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  *(undefined4 *)&in_RDI[3]._M_str = 0;
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_02,in_RDI,__a);
  std::allocator<char>::~allocator(local_29);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_02,in_RDI,__a);
  std::allocator<char>::~allocator(local_3d);
  this_00 = (function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)
            (in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_02,in_RDI,__a);
  std::allocator<char>::~allocator(&local_3e);
  std::__cxx11::string::string(this_01);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::function(this_00)
  ;
  *(undefined1 *)&in_RDI[0xe]._M_len = 0;
  return;
}

Assistant:

InputData(std::string_view n_name, std::string_view n_type, std::string_view n_units):
        name(n_name), type(n_type), units(n_units)
    {
    }